

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double anglit_cdf(double x)

{
  double dVar1;
  double r8_pi;
  double cdf;
  double x_local;
  
  if (-0.7853981633974483 <= x) {
    if (0.7853981633974483 <= x) {
      r8_pi = 1.0;
    }
    else {
      dVar1 = cos(x + x + 1.5707963267948966);
      r8_pi = dVar1 * -0.5 + 0.5;
    }
  }
  else {
    r8_pi = 0.0;
  }
  return r8_pi;
}

Assistant:

double anglit_cdf ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    ANGLIT_CDF evaluates the Anglit CDF.
//
//  Modified:
//
//    29 December 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Output, double ANGLIT_CDF, the value of the CDF.
//
{
  double cdf;
  const double r8_pi = 3.14159265358979323;

  if ( x <  - 0.25 * r8_pi )
  {
    cdf = 0.0;
  }
  else if ( x < 0.25 * r8_pi )
  {
    cdf = 0.5 - 0.5 * cos ( 2.0 * x + r8_pi / 2.0 );
  }
  else
  {
    cdf = 1.0;
  }

  return cdf;
}